

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::NewLine(void)

{
  ImGuiLayoutType IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImVec2 local_18;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    IVar1 = (pIVar2->DC).LayoutType;
    (pIVar2->DC).LayoutType = 1;
    if ((pIVar2->DC).CurrLineSize.y <= 0.0) {
      local_18 = (ImVec2)((ulong)(uint)pIVar3->FontSize << 0x20);
    }
    else {
      local_18.x = 0.0;
      local_18.y = 0.0;
    }
    ItemSize(&local_18,-1.0);
    (pIVar2->DC).LayoutType = IVar1;
  }
  return;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}